

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool Assimp::PLY::ElementInstance::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Element *pcElement,ElementInstance *p_pcOut,bool p_bBE)

{
  PropertyInstance *p_pcOut_00;
  pointer prop;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("__null != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x32a,
                  "static bool Assimp::PLY::ElementInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstance *, bool)"
                 );
  }
  if (p_pcOut != (ElementInstance *)0x0) {
    std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>::
    resize(&p_pcOut->alProperties,
           ((long)(pcElement->alProperties).
                  super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(pcElement->alProperties).
                 super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x30);
    prop = (pcElement->alProperties).
           super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl
           .super__Vector_impl_data._M_start;
    for (p_pcOut_00 = (p_pcOut->alProperties).
                      super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        p_pcOut_00 !=
        (p_pcOut->alProperties).
        super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
        ._M_impl.super__Vector_impl_data._M_finish; p_pcOut_00 = p_pcOut_00 + 1) {
      PropertyInstance::ParseInstanceBinary
                (streamBuffer,buffer,pCur,bufferSize,prop,p_pcOut_00,p_bBE);
      prop = prop + 1;
    }
    return true;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x32b,
                "static bool Assimp::PLY::ElementInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstance *, bool)"
               );
}

Assistant:

bool PLY::ElementInstance::ParseInstanceBinary(
  IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Element* pcElement,
  PLY::ElementInstance* p_pcOut,
  bool p_bBE /* = false */)
{
  ai_assert(NULL != pcElement);
  ai_assert(NULL != p_pcOut);

  // allocate enough storage
  p_pcOut->alProperties.resize(pcElement->alProperties.size());

  std::vector<PLY::PropertyInstance>::iterator i = p_pcOut->alProperties.begin();
  std::vector<PLY::Property>::const_iterator   a = pcElement->alProperties.begin();
  for (; i != p_pcOut->alProperties.end(); ++i, ++a)
  {
    if (!(PLY::PropertyInstance::ParseInstanceBinary(streamBuffer, buffer, pCur, bufferSize, &(*a), &(*i), p_bBE)))
    {
        ASSIMP_LOG_WARN("Unable to parse binary property instance. "
        "Skipping this element instance");

      (*i).avList.push_back(PLY::PropertyInstance::DefaultValue((*a).eType));
    }
  }
  return true;
}